

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_ml_prune_4_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int part_ctx,int64_t best_rd,
               PartitionSearchState *part_state,int *part4_allowed,uint pb_source_variance)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  MACROBLOCK *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  buf_2d *in_R9;
  int in_stack_00000008;
  int i_8;
  int thresh;
  int i_7;
  int max_score;
  int int_score [4];
  float score [4];
  float var_ratio_1;
  int i_6;
  float var_ratio;
  int i_5;
  float high_b;
  float low_b;
  float denom;
  int i_4;
  buf_2d vert_4_src;
  buf_2d horz_4_src;
  MACROBLOCKD *xd;
  uint8_t *src;
  int src_stride;
  BLOCK_SIZE vert_4_bs;
  BLOCK_SIZE horz_4_bs;
  uint vert_4_source_var [4];
  uint horz_4_source_var [4];
  float rd_ratio;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int rd_index;
  int sub_block_rdcost [8];
  int rdcost;
  int feature_index;
  float features [18];
  NN_CONFIG *nn_config;
  int64_t *vert_rd;
  int64_t *horz_rd;
  int64_t *split_rd;
  int64_t (*rect_part_rd) [2];
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams blk_params;
  int64_t (*in_stack_000028f8) [2];
  int64_t in_stack_00002900;
  int in_stack_00002908;
  BLOCK_SIZE in_stack_0000290f;
  MACROBLOCK *in_stack_00002910;
  AV1_COMP *in_stack_00002918;
  int64_t *in_stack_00002940;
  int *in_stack_00002948;
  int *in_stack_00002950;
  uint in_stack_00002958;
  int in_stack_00002960;
  int in_stack_00002968;
  buf_2d *ref;
  MACROBLOCKD *xd_00;
  undefined4 in_stack_fffffffffffffda4;
  int local_244;
  long lVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  MACROBLOCK *x_00;
  uint local_218;
  int local_214;
  int local_210;
  int local_20c;
  int aiStack_208 [4];
  float local_1f8 [6];
  float local_1e0;
  int local_1dc;
  float local_1d8;
  int local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  float local_1c8;
  int local_1c4;
  long local_1c0;
  int local_1a8;
  long local_1a0;
  int local_188;
  long local_180;
  long local_178;
  int local_170;
  BLOCK_SIZE local_16a;
  BLOCK_SIZE local_169;
  uint local_168 [4];
  uint local_158 [3];
  BLOCK_SIZE in_stack_fffffffffffffeb7;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  float in_stack_fffffffffffffec0;
  int iVar10;
  int local_138;
  int iVar11;
  undefined1 is_test_mode;
  int iVar12;
  int iVar13;
  int local_128 [2];
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int local_fc;
  float local_f8 [20];
  NN_CONFIG *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  char local_7d;
  undefined4 local_7c;
  undefined4 local_78;
  undefined1 local_74 [4];
  undefined4 local_70;
  undefined4 local_6c;
  char local_4c;
  buf_2d *local_48;
  long local_40;
  MACROBLOCK *local_38;
  int local_2c;
  long local_28;
  long local_20;
  
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_2c = in_EDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  memcpy(local_74,(void *)(in_R8 + 8),0x2c);
  local_78 = local_70;
  local_7c = local_6c;
  local_7d = local_4c;
  local_88 = local_40 + 0xe8;
  lVar5 = local_40 + 200;
  xd_00 = (MACROBLOCKD *)((long)&local_48->buf + 4);
  ref = local_48;
  iVar4 = in_stack_00000008;
  local_90 = lVar5;
  _Var1 = ext_ml_model_decision_after_part_ab
                    (in_stack_00002918,in_stack_00002910,in_stack_0000290f,in_stack_00002908,
                     in_stack_00002900,in_stack_000028f8,in_stack_00002940,in_stack_00002948,
                     in_stack_00002950,in_stack_00002958,in_stack_00002960,in_stack_00002968);
  if ((!_Var1) && ((long)local_38 < 1000000000)) {
    local_98 = local_88;
    local_a0 = local_88 + 0x10;
    local_a8 = (NN_CONFIG *)0x0;
    if (local_7d == '\x06') {
      local_a8 = &av1_4_partition_nnconfig_16;
    }
    else if (local_7d == '\t') {
      local_a8 = &av1_4_partition_nnconfig_32;
    }
    else if (local_7d == '\f') {
      local_a8 = &av1_4_partition_nnconfig_64;
    }
    if (local_a8 != (NN_CONFIG *)0x0) {
      local_f8[0] = (float)local_2c;
      iVar2 = get_unsigned_bits(0);
      local_f8[1] = (float)iVar2;
      x_00 = local_38;
      if (0x7fffffff < (long)local_38) {
        x_00 = (MACROBLOCK *)0x7fffffff;
      }
      iVar2 = (int)x_00;
      memset(local_128,0,0x20);
      iVar13 = 0;
      for (iVar12 = 0; iVar12 < 2; iVar12 = iVar12 + 1) {
        if ((0 < *(long *)(local_98 + (long)iVar12 * 8)) &&
           (*(long *)(local_98 + (long)iVar12 * 8) < 1000000000)) {
          local_128[iVar13] = (int)*(undefined8 *)(local_98 + (long)iVar12 * 8);
        }
        iVar13 = iVar13 + 1;
      }
      for (iVar11 = 0; iVar11 < 2; iVar11 = iVar11 + 1) {
        if ((0 < *(long *)(local_a0 + (long)iVar11 * 8)) &&
           (*(long *)(local_a0 + (long)iVar11 * 8) < 1000000000)) {
          local_128[iVar13] = (int)*(undefined8 *)(local_a0 + (long)iVar11 * 8);
        }
        iVar13 = iVar13 + 1;
      }
      for (local_138 = 0; local_138 < 4; local_138 = local_138 + 1) {
        if ((0 < *(long *)(local_90 + (long)local_138 * 8)) &&
           (*(long *)(local_90 + (long)local_138 * 8) < 1000000000)) {
          local_128[iVar13] = (int)*(undefined8 *)(local_90 + (long)local_138 * 8);
        }
        iVar13 = iVar13 + 1;
      }
      local_fc = 2;
      for (iVar10 = 0; iVar10 < 8; iVar10 = iVar10 + 1) {
        in_stack_fffffffffffffec0 = 1.0;
        if ((0 < local_128[iVar10]) && (local_128[iVar10] < iVar2)) {
          in_stack_fffffffffffffec0 = (float)local_128[iVar10] / (float)iVar2;
        }
        local_f8[local_fc] = in_stack_fffffffffffffec0;
        local_fc = local_fc + 1;
      }
      memset(local_158,0,0x10);
      memset(local_168,0,0x10);
      local_169 = get_partition_subsize
                            ((BLOCK_SIZE)((ulong)ref >> 0x30),(PARTITION_TYPE)((ulong)ref >> 0x28));
      local_16a = get_partition_subsize
                            ((BLOCK_SIZE)((ulong)ref >> 0x30),(PARTITION_TYPE)((ulong)ref >> 0x28));
      uVar7 = *(undefined8 *)(local_20 + 0x427a8);
      lVar6 = local_28;
      uVar8 = local_78;
      uVar9 = local_7c;
      av1_num_planes((AV1_COMMON *)(local_20 + 0x3bf80));
      av1_setup_src_planes
                (x_00,(YV12_BUFFER_CONFIG *)CONCAT44(uVar9,uVar8),(int)((ulong)uVar7 >> 0x20),
                 (int)uVar7,(int)((ulong)lVar6 >> 0x20),(BLOCK_SIZE)((ulong)lVar6 >> 0x18));
      local_170 = *(int *)(local_28 + 0x48);
      local_178 = *(long *)(local_28 + 0x30);
      local_180 = local_28 + 0x1a0;
      local_188 = local_170;
      local_1a8 = local_170;
      for (local_1c4 = 0; is_test_mode = (undefined1)((uint)iVar11 >> 0x18), local_1c4 < 4;
          local_1c4 = local_1c4 + 1) {
        local_1a0 = local_178 + (int)(local_1c4 * (uint)block_size_high[local_169] * local_170);
        local_1c0 = local_178 + (int)(local_1c4 * (uint)block_size_wide[local_16a]);
        uVar3 = av1_get_perpixel_variance_facade
                          ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffda4,iVar4),xd_00,ref,
                           (BLOCK_SIZE)((ulong)lVar5 >> 0x38),(int)lVar5);
        local_158[local_1c4] = uVar3;
        uVar3 = av1_get_perpixel_variance_facade
                          ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffda4,iVar4),xd_00,ref,
                           (BLOCK_SIZE)((ulong)lVar5 >> 0x38),(int)lVar5);
        local_168[local_1c4] = uVar3;
      }
      local_1c8 = (float)(in_stack_00000008 + 1);
      local_1cc = 0x3dcccccd;
      local_1d0 = 0x41200000;
      for (local_1d4 = 0; local_1d4 < 4; local_1d4 = local_1d4 + 1) {
        local_1d8 = (float)(local_158[local_1d4] + 1) / local_1c8;
        if (local_1d8 < 0.1) {
          local_1d8 = 0.1;
        }
        if (10.0 < local_1d8) {
          local_1d8 = 10.0;
        }
        local_f8[local_fc] = local_1d8;
        local_fc = local_fc + 1;
      }
      for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
        local_1e0 = (float)(local_168[local_1dc] + 1) / local_1c8;
        if (local_1e0 < 0.1) {
          local_1e0 = 0.1;
        }
        if (10.0 < local_1e0) {
          local_1e0 = 10.0;
        }
        local_f8[local_fc] = local_1e0;
        local_fc = local_fc + 1;
      }
      iVar4 = frame_is_intra_only((AV1_COMMON *)(local_20 + 0x3bf80));
      if (iVar4 == 0) {
        write_features_to_file
                  ((char *)CONCAT44(iVar13,iVar12),(_Bool)is_test_mode,
                   (float *)CONCAT44(iVar10,in_stack_fffffffffffffec0),in_stack_fffffffffffffebc,
                   in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb7,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffee8);
      }
      memset(local_1f8,0,0x10);
      (*av1_nn_predict)(local_f8,local_a8,1,local_1f8);
      local_20c = -1000;
      for (local_210 = 0; local_210 < 4; local_210 = local_210 + 1) {
        aiStack_208[local_210] = (int)(local_1f8[local_210] * 100.0);
        if (local_20c < aiStack_208[local_210]) {
          local_244 = aiStack_208[local_210];
        }
        else {
          local_244 = local_20c;
        }
        local_20c = local_244;
      }
      local_214 = local_20c;
      if (local_7d == '\x06') {
        local_214 = local_20c + -500;
      }
      else if (local_7d == '\t') {
        local_214 = local_20c + -500;
      }
      else if (local_7d == '\f') {
        local_214 = local_20c + -200;
      }
      memset(local_48,0,8);
      for (local_218 = 0; (int)local_218 < 4; local_218 = local_218 + 1) {
        if (local_214 <= aiStack_208[(int)local_218]) {
          if ((local_218 & 1) != 0) {
            *(undefined4 *)&local_48->buf = 1;
          }
          if (((int)local_218 >> 1 & 1U) != 0) {
            *(undefined4 *)((long)&local_48->buf + 4) = 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_ml_prune_4_partition(AV1_COMP *const cpi, MACROBLOCK *const x,
                              int part_ctx, int64_t best_rd,
                              PartitionSearchState *part_state,
                              int *part4_allowed,
                              unsigned int pb_source_variance) {
  const PartitionBlkParams blk_params = part_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;

  int64_t(*rect_part_rd)[SUB_PARTITIONS_RECT] = part_state->rect_part_rd;
  int64_t *split_rd = part_state->split_rd;
  if (ext_ml_model_decision_after_part_ab(
          cpi, x, bsize, part_ctx, best_rd, rect_part_rd, split_rd,
          &part4_allowed[HORZ4], &part4_allowed[VERT4], pb_source_variance,
          mi_row, mi_col))
    return;

  if (best_rd >= 1000000000) return;
  int64_t *horz_rd = rect_part_rd[HORZ4];
  int64_t *vert_rd = rect_part_rd[VERT4];
  const NN_CONFIG *nn_config = NULL;
  // 4-way partitions are only allowed for these three square block sizes.
  switch (bsize) {
    case BLOCK_16X16: nn_config = &av1_4_partition_nnconfig_16; break;
    case BLOCK_32X32: nn_config = &av1_4_partition_nnconfig_32; break;
    case BLOCK_64X64: nn_config = &av1_4_partition_nnconfig_64; break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // Generate features.
  float features[FEATURES];
  int feature_index = 0;
  features[feature_index++] = (float)part_ctx;
  features[feature_index++] = (float)get_unsigned_bits(pb_source_variance);

  const int rdcost = (int)AOMMIN(INT_MAX, best_rd);
  int sub_block_rdcost[8] = { 0 };
  int rd_index = 0;
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (horz_rd[i] > 0 && horz_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)horz_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
    if (vert_rd[i] > 0 && vert_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)vert_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      sub_block_rdcost[rd_index] = (int)split_rd[i];
    ++rd_index;
  }
  for (int i = 0; i < 8; ++i) {
    // Ratio between the sub-block RD and the whole-block RD.
    float rd_ratio = 1.0f;
    if (sub_block_rdcost[i] > 0 && sub_block_rdcost[i] < rdcost)
      rd_ratio = (float)sub_block_rdcost[i] / (float)rdcost;
    features[feature_index++] = rd_ratio;
  }

  // Get variance of the 1:4 and 4:1 sub-blocks.
  unsigned int horz_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  unsigned int vert_4_source_var[SUB_PARTITIONS_PART4] = { 0 };
  {
    BLOCK_SIZE horz_4_bs = get_partition_subsize(bsize, PARTITION_HORZ_4);
    BLOCK_SIZE vert_4_bs = get_partition_subsize(bsize, PARTITION_VERT_4);

    assert(horz_4_bs != BLOCK_INVALID);
    assert(vert_4_bs != BLOCK_INVALID);

    av1_setup_src_planes(x, cpi->source, mi_row, mi_col,
                         av1_num_planes(&cpi->common), bsize);
    const int src_stride = x->plane[0].src.stride;
    uint8_t *src = x->plane[0].src.buf;
    const MACROBLOCKD *const xd = &x->e_mbd;

    struct buf_2d horz_4_src, vert_4_src;
    horz_4_src.stride = src_stride;
    vert_4_src.stride = src_stride;

    for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
      horz_4_src.buf = src + i * block_size_high[horz_4_bs] * src_stride;
      vert_4_src.buf = src + i * block_size_wide[vert_4_bs];

      horz_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &horz_4_src, horz_4_bs, AOM_PLANE_Y);
      vert_4_source_var[i] = av1_get_perpixel_variance_facade(
          cpi, xd, &vert_4_src, vert_4_bs, AOM_PLANE_Y);
    }
  }

  const float denom = (float)(pb_source_variance + 1);
  const float low_b = 0.1f;
  const float high_b = 10.0f;
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 4:1 sub-block variance and the whole-block variance.
    float var_ratio = (float)(horz_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  for (int i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    // Ratio between the 1:4 sub-block RD and the whole-block RD.
    float var_ratio = (float)(vert_4_source_var[i] + 1) / denom;
    if (var_ratio < low_b) var_ratio = low_b;
    if (var_ratio > high_b) var_ratio = high_b;
    features[feature_index++] = var_ratio;
  }
  assert(feature_index == FEATURES);

  // Write features to file
  if (!frame_is_intra_only(&cpi->common)) {
    write_features_to_file(cpi->oxcf.partition_info_path,
                           cpi->ext_part_controller.test_mode, features,
                           FEATURES, 7, bsize, mi_row, mi_col);
  }

  // Calculate scores using the NN model.
  float score[LABELS] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, score);
  int int_score[LABELS];
  int max_score = -1000;
  for (int i = 0; i < LABELS; ++i) {
    int_score[i] = (int)(100 * score[i]);
    max_score = AOMMAX(int_score[i], max_score);
  }

  // Make decisions based on the model scores.
  int thresh = max_score;
  switch (bsize) {
    case BLOCK_16X16: thresh -= 500; break;
    case BLOCK_32X32: thresh -= 500; break;
    case BLOCK_64X64: thresh -= 200; break;
    default: break;
  }
  av1_zero_array(part4_allowed, NUM_PART4_TYPES);
  for (int i = 0; i < LABELS; ++i) {
    if (int_score[i] >= thresh) {
      if ((i >> 0) & 1) part4_allowed[HORZ4] = 1;
      if ((i >> 1) & 1) part4_allowed[VERT4] = 1;
    }
  }
}